

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O2

void Bac_NtkDeriveFanout(Bac_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if ((p->vFanout).pArray != (int *)0x0) {
    __assert_fail("!Bac_NtkHasFanouts(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0xf4,"void Bac_NtkDeriveFanout(Bac_Ntk_t *)");
  }
  iVar1 = (p->vType).nCap;
  if (iVar1 != 0) {
    iVar4 = 0;
    Vec_IntFill(&p->vFanout,iVar1,0);
    do {
      iVar1 = (p->vType).nSize;
      if (iVar1 <= iVar4) {
        for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
          iVar1 = Bac_ObjIsCo(p,iVar4);
          if (iVar1 != 0) {
            iVar1 = Bac_ObjNextFanout(p,iVar4);
            if (iVar1 == 0) {
              iVar1 = Bac_ObjFanin(p,iVar4);
              Bac_ObjSetFanout(p,iVar1,iVar4);
            }
          }
          iVar1 = (p->vType).nSize;
        }
        return;
      }
      iVar1 = Bac_ObjIsCo(p,iVar4);
      if (iVar1 != 0) {
        iVar1 = Bac_ObjNextFanout(p,iVar4);
        if (iVar1 != 0) {
          __assert_fail("!Bac_ObjNextFanout(p, iCo)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                        ,0xf8,"void Bac_NtkDeriveFanout(Bac_Ntk_t *)");
        }
        iVar1 = Bac_ObjFanin(p,iVar4);
        iVar2 = Bac_ObjFanout(p,iVar1);
        if (iVar2 != 0) {
          iVar2 = Bac_ObjFanout(p,iVar1);
          iVar3 = Bac_ObjIsCo(p,iVar2);
          if (iVar3 == 0) {
            __assert_fail("Bac_ObjIsCo(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0x128,"void Bac_ObjSetNextFanout(Bac_Ntk_t *, int, int)");
          }
          Vec_IntSetEntry(&p->vFanout,iVar2,iVar4);
        }
        Bac_ObjSetFanout(p,iVar1,iVar4);
      }
      iVar4 = iVar4 + 1;
    } while( true );
  }
  __assert_fail("Bac_NtkObjNumAlloc(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                ,0xfd,"void Bac_NtkStartFanouts(Bac_Ntk_t *)");
}

Assistant:

void Bac_NtkDeriveFanout( Bac_Ntk_t * p )
{
    int iCi, iCo;
    assert( !Bac_NtkHasFanouts(p) );
    Bac_NtkStartFanouts( p );
    Bac_NtkForEachCo( p, iCo )
    {
        assert( !Bac_ObjNextFanout(p, iCo) );
        iCi = Bac_ObjFanin(p, iCo);
        if ( Bac_ObjFanout(p, iCi) )
            Bac_ObjSetNextFanout( p, Bac_ObjFanout(p, iCi), iCo );
        Bac_ObjSetFanout( p, iCi, iCo );
    }
    Bac_NtkForEachCo( p, iCo )
        if ( !Bac_ObjNextFanout(p, iCo) )
            Bac_ObjSetFanout( p, Bac_ObjFanin(p, iCo), iCo );
}